

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O2

int searchAll48(uint64_t **seedbuf,uint64_t *buflen,char *path,int threads,uint64_t *lowBits,
               int lowBitN,_func_int_uint64_t_void_ptr *check,void *data,char *stop)

{
  int64_t *piVar1;
  void *pvVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  void *__ptr;
  pthread_t *__ptr_00;
  size_t sVar6;
  ulong uVar7;
  FILE *pFVar8;
  uint64_t *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint64_t uVar13;
  ulong uVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  pthread_t *__newthread;
  int64_t lentry;
  uint local_10b0;
  char local_1039;
  char dpath [4096];
  
  lVar17 = (long)threads;
  __ptr = malloc(lVar17 * 0x1370);
  __ptr_00 = (pthread_t *)malloc(lVar17 * 8);
  if (path == (char *)0x0) {
    if (buflen != (uint64_t *)0x0 && seedbuf != (uint64_t **)0x0) {
LAB_001224b4:
      if (threads < 1) {
        threads = 0;
      }
      uVar14 = (ulong)(uint)threads;
      uVar7 = 0;
      while (uVar11 = uVar14, pvVar15 = __ptr, __newthread = __ptr_00, uVar7 != uVar14) {
        lVar12 = uVar7 * 0x1370;
        piVar1 = (int64_t *)((long)__ptr + lVar12);
        uVar11 = uVar7 + 1;
        *(long *)((long)__ptr + lVar12) = (long)(uVar7 << 0x30) / lVar17;
        *(long *)((long)__ptr + lVar12 + 8) = (long)(uVar11 << 0x30) / lVar17 + -1;
        *(uint64_t **)((long)__ptr + lVar12 + 0x10) = lowBits;
        *(int *)((long)__ptr + lVar12 + 0x18) = lowBitN;
        *(undefined1 *)((long)__ptr + lVar12 + 0x1c) = 0;
        *(_func_int_uint64_t_void_ptr **)((long)__ptr + lVar12 + 0x20) = check;
        *(void **)((long)__ptr + lVar12 + 0x28) = data;
        *(char **)((long)__ptr + lVar12 + 0x30) = stop;
        if (path == (char *)0x0) {
          *(undefined1 *)(piVar1 + 7) = 0;
          piVar1[0x207] = 0;
          uVar7 = uVar11;
        }
        else {
          pcVar18 = (char *)((long)__ptr + lVar12 + 0x38);
          snprintf(pcVar18,0x1000,"%s.part%d",path,uVar7 & 0xffffffff);
          pFVar8 = fopen(pcVar18,"a+");
          if (pFVar8 == (FILE *)0x0) goto LAB_001228dc;
          lVar20 = 0;
          bVar4 = false;
          lVar12 = 0;
          while (lVar12 != -0x1f) {
            iVar5 = fseek(pFVar8,lVar12 + -1,2);
            if (((iVar5 != 0) || (iVar5 = fgetc(pFVar8), iVar5 < 1)) || (bVar4 && iVar5 == 10)) {
              iVar5 = fseek(pFVar8,lVar20 >> 0x20,2);
              if (((iVar5 == 0) && (sVar6 = fread(dpath,-lVar12,1,pFVar8), sVar6 != 0)) &&
                 (iVar5 = __isoc99_sscanf(dpath,"%ld",&lentry), iVar5 == 1)) {
                *piVar1 = lentry;
                *(undefined1 *)((long)piVar1 + 0x1c) = 1;
                printf("Continuing thread %d at seed %ld\n");
              }
              break;
            }
            bVar4 = (bool)(bVar4 | iVar5 != 10);
            lVar20 = lVar20 + -0x100000000;
            lVar12 = lVar12 + -1;
          }
          fseek(pFVar8,0,2);
          piVar1[0x207] = (int64_t)pFVar8;
          uVar7 = uVar11;
        }
      }
      while (uVar11 != 0) {
        pthread_create(__newthread,(pthread_attr_t *)0x0,searchAll48Thread,pvVar15);
        uVar11 = uVar11 - 1;
        pvVar15 = (void *)((long)pvVar15 + 0x1370);
        __newthread = __newthread + 1;
      }
      for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
        pthread_join(__ptr_00[uVar7],(void **)0x0);
      }
      if ((stop == (char *)0x0) || (*stop == '\0')) {
        if (path == (char *)0x0) {
          *buflen = 0;
          uVar13 = 0;
          for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
            lVar17 = (long)__ptr + uVar7 * 0x1370 + 0x1040;
            do {
              uVar13 = uVar13 + *(long *)(lVar17 + 800);
              *buflen = uVar13;
              lVar17 = *(long *)(lVar17 + 0x328);
            } while (lVar17 != 0);
          }
          puVar9 = (uint64_t *)malloc(uVar13 << 3);
          *seedbuf = puVar9;
          if (puVar9 == (uint64_t *)0x0) {
            exit(1);
          }
          lVar17 = 0;
          for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
            pvVar16 = (void *)((long)__ptr + uVar7 * 0x1370 + 0x1040);
            pvVar15 = pvVar16;
            do {
              memcpy(*seedbuf + (int)lVar17,pvVar15,*(long *)((long)pvVar15 + 800) << 3);
              lVar17 = (long)(int)lVar17 + *(long *)((long)pvVar15 + 800);
              pvVar2 = *(void **)((long)pvVar15 + 0x328);
              if (pvVar15 != pvVar16) {
                free(pvVar15);
              }
              pvVar15 = pvVar2;
            } while (pvVar2 != (void *)0x0);
          }
        }
        else {
          pFVar8 = fopen(path,"w");
          if (pFVar8 == (FILE *)0x0) goto LAB_001228dc;
          for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
            lVar17 = uVar7 * 0x1370;
            rewind(*(FILE **)((long)__ptr + lVar17 + 0x1038));
            while (sVar6 = fread(dpath,1,0x1000,*(FILE **)((long)__ptr + lVar17 + 0x1038)),
                  sVar6 != 0) {
              sVar6 = fwrite(dpath,1,sVar6,pFVar8);
              if (sVar6 == 0) {
                fclose(pFVar8);
                goto LAB_001228dc;
              }
            }
            fclose(*(FILE **)((long)__ptr + lVar17 + 0x1038));
            remove((char *)((long)__ptr + lVar17 + 0x38));
          }
          fclose(pFVar8);
          if (buflen != (uint64_t *)0x0 && seedbuf != (uint64_t **)0x0) {
            puVar9 = loadSavedSeeds(path,buflen);
            *seedbuf = puVar9;
          }
        }
        iVar5 = 0;
        goto LAB_001228e0;
      }
    }
  }
  else {
    sVar6 = strlen(path);
    if (0xffffffffffffefff < sVar6 - 0xff8) {
      strcpy(dpath,path);
      uVar7 = sVar6 & 0xffffffff;
      do {
        uVar7 = uVar7 - 1;
        if ((int)(uint)uVar7 < 0) goto LAB_001224b4;
        uVar10 = (uint)uVar7 & 0x7fffffff;
      } while (dpath[uVar10] != '/');
      dpath[uVar10] = '\0';
      sVar6 = strlen(dpath);
      pcVar18 = &local_1039;
      do {
        pcVar19 = pcVar18 + 1;
        pcVar18 = pcVar18 + 1;
      } while (*pcVar19 == '/');
      uVar10 = 0;
      while ((uVar10 == 0 && (pcVar19 = pcVar18, pcVar18 < dpath + (int)sVar6))) {
        do {
          pcVar3 = pcVar19;
          pcVar19 = pcVar3 + 1;
          if (*pcVar3 == '\0') break;
        } while (*pcVar3 != '/');
        if (pcVar18 != dpath) {
          pcVar18[-1] = '/';
        }
        *pcVar3 = '\0';
        iVar5 = stat(dpath,(stat *)&lentry);
        pcVar18 = pcVar19;
        if (iVar5 == -1) {
          uVar10 = mkdir(dpath,0x1ed);
        }
        else {
          uVar10 = (uint)((local_10b0 & 0xf000) != 0x4000);
        }
      }
      if (uVar10 == 0) goto LAB_001224b4;
    }
  }
LAB_001228dc:
  iVar5 = 1;
LAB_001228e0:
  free(__ptr_00);
  free(__ptr);
  return iVar5;
}

Assistant:

int searchAll48(
        uint64_t **         seedbuf,
        uint64_t *          buflen,
        const char *        path,
        int                 threads,
        const uint64_t *    lowBits,
        int                 lowBitN,
        int (*check)(uint64_t s48, void *data),
        void *              data,
        volatile char *     stop
        )
{
    threadinfo_t *info = (threadinfo_t*) malloc(threads* sizeof(*info));
    thread_id_t *tids = (thread_id_t*) malloc(threads* sizeof(*tids));
    int i, t;
    int err = 0;

    if (path)
    {
        size_t pathlen = strlen(path);
        char dpath[MAX_PATHLEN];

        // split path into directory and file and create missing directories
        if (pathlen + 8 >= sizeof(dpath))
            goto L_err;
        strcpy(dpath, path);

        for (i = pathlen-1; i >= 0; i--)
        {
            if (IS_DIR_SEP(dpath[i]))
            {
                dpath[i] = 0;
                if (mkdirp(dpath))
                    goto L_err;
                break;
            }
        }
    }
    else if (seedbuf == NULL || buflen == NULL)
    {
        // no file and no buffer return: no output possible
        goto L_err;
    }

    // prepare the thread info and load progress if present
    for (t = 0; t < threads; t++)
    {
        info[t].start = (t * (MASK48+1) / threads);
        info[t].end = ((t+1) * (MASK48+1) / threads - 1);
        info[t].lowBits = lowBits;
        info[t].lowBitN = lowBitN;
        info[t].skipStart = 0;
        info[t].check = check;
        info[t].data = data;
        info[t].stop = stop;

        if (path)
        {
            // progress file of this thread
            snprintf(info[t].path, sizeof(info[t].path), "%s.part%d", path, t);
            FILE *fp = fopen(info[t].path, "a+");
            if (fp == NULL)
                goto L_err;

            int c, nnl = 0;
            char buf[32];

            // find the last newline
            for (i = 1; i < 32; i++)
            {
                if (fseek(fp, -i, SEEK_END)) break;
                c = fgetc(fp);
                if (c <= 0 || (nnl && c == '\n')) break;
                nnl |= (c != '\n');
            }

            if (i < 32 && !fseek(fp, 1-i, SEEK_END) && fread(buf, i-1, 1, fp) > 0)
            {
                // read the last entry, and replace the start seed accordingly
                int64_t lentry;
                if (sscanf(buf, "%" PRId64, &lentry) == 1)
                {
                    info[t].start = lentry;
                    info[t].skipStart = 1;
                    printf("Continuing thread %d at seed %" PRId64 "\n",
                        t, lentry);
                }
            }

            fseek(fp, 0, SEEK_END);
            info[t].fp = fp;
        }
        else
        {
            info[t].path[0] = 0;
            info[t].fp = NULL;
        }
    }


    // run the threads
#ifdef USE_PTHREAD

    for (t = 0; t < threads; t++)
    {
        pthread_create(&tids[t], NULL, searchAll48Thread, (void*)&info[t]);
    }

    for (t = 0; t < threads; t++)
    {
        pthread_join(tids[t], NULL);
    }

#else

    for (t = 0; t < threads; t++)
    {
        tids[t] = CreateThread(NULL, 0, searchAll48Thread,
            (LPVOID)&info[t], 0, NULL);
    }

    WaitForMultipleObjects(threads, tids, TRUE, INFINITE);

#endif

    if (stop && *stop)
        goto L_err;

    if (path)
    {
        // merge partial files
        FILE *fp = fopen(path, "w");
        if (fp == NULL)
            goto L_err;

        for (t = 0; t < threads; t++)
        {
            rewind(info[t].fp);

            char buffer[4097];
            size_t n;
            while ((n = fread(buffer, sizeof(char), 4096, info[t].fp)))
            {
                if (!fwrite(buffer, sizeof(char), n, fp))
                {
                    fclose(fp);
                    goto L_err;
                }
            }

            fclose(info[t].fp);
            remove(info[t].path);
        }

        fclose(fp);

        if (seedbuf && buflen)
        {
            *seedbuf = loadSavedSeeds(path, buflen);
        }
    }
    else
    {
        // merge linked seed buffers
        *buflen = 0;

        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                *buflen += lp->len;
                lp = lp->next;
            }
            while (lp);
        }

        *seedbuf = (uint64_t*) malloc((*buflen) * sizeof(uint64_t));
        if (*seedbuf == NULL)
            exit(1);

        i = 0;
        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                memcpy(*seedbuf + i, lp->seeds, lp->len * sizeof(uint64_t));
                i += lp->len;
                linked_seeds_t *tmp = lp;
                lp = lp->next;
                if (tmp != &info[t].ls)
                    free(tmp);
            }
            while (lp);
        }
    }

    if (0)
L_err:
        err = 1;

    free(tids);
    free(info);

    return err;
}